

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlReconciliateNs(xmlDocPtr doc,xmlNodePtr tree)

{
  _xmlAttr *p_Var1;
  int iVar2;
  ulong uVar3;
  xmlNsPtr pxVar4;
  ulong uVar5;
  _xmlNode *p_Var6;
  xmlNsPtr *ppxVar7;
  xmlNsCache *pxVar8;
  uint uVar9;
  xmlNs *pxVar10;
  xmlNodePtr pxVar11;
  _xmlAttr **pp_Var12;
  int local_40;
  int sizeCache;
  xmlNsCache *cache;
  
  cache = (xmlNsCache *)0x0;
  sizeCache = 0;
  local_40 = -1;
  if (((tree != (xmlNodePtr)0x0) && (tree->type == XML_ELEMENT_NODE)) && (tree->doc == doc)) {
    uVar9 = 0;
    local_40 = 0;
    pxVar11 = tree;
    while (p_Var6 = pxVar11, pxVar8 = cache, p_Var6 != (xmlNodePtr)0x0) {
      pxVar10 = p_Var6->ns;
      if (pxVar10 != (xmlNs *)0x0) {
        uVar3 = 0;
        if (0 < (int)uVar9) {
          uVar3 = (ulong)uVar9;
        }
        ppxVar7 = &cache->newNs;
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          if (((xmlNsCache *)(ppxVar7 + -1))->oldNs == pxVar10) {
            pxVar10 = *ppxVar7;
            p_Var6->ns = pxVar10;
            uVar3 = uVar5 & 0xffffffff;
            break;
          }
          ppxVar7 = ppxVar7 + 2;
        }
        if ((uint)uVar3 == uVar9) {
          pxVar4 = xmlNewReconciledNs(tree,pxVar10);
          if ((pxVar4 == (xmlNsPtr)0x0) ||
             ((sizeCache <= (int)uVar9 &&
              (iVar2 = xmlGrowNsCache(&cache,&sizeCache), pxVar8 = cache, iVar2 < 0)))) {
            local_40 = -1;
          }
          else {
            pxVar8[(int)uVar9].newNs = pxVar4;
            pxVar8[(int)uVar9].oldNs = p_Var6->ns;
            uVar9 = uVar9 + 1;
          }
          p_Var6->ns = pxVar4;
        }
      }
      if (p_Var6->type == XML_ELEMENT_NODE) {
        pp_Var12 = &p_Var6->properties;
        while (pxVar8 = cache, p_Var1 = *pp_Var12, p_Var1 != (_xmlAttr *)0x0) {
          pxVar10 = p_Var1->ns;
          if (pxVar10 != (xmlNs *)0x0) {
            uVar3 = 0;
            if (0 < (int)uVar9) {
              uVar3 = (ulong)uVar9;
            }
            ppxVar7 = &cache->newNs;
            for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
              if (((xmlNsCache *)(ppxVar7 + -1))->oldNs == pxVar10) {
                pxVar10 = *ppxVar7;
                p_Var1->ns = pxVar10;
                uVar3 = uVar5 & 0xffffffff;
                break;
              }
              ppxVar7 = ppxVar7 + 2;
            }
            if ((uint)uVar3 == uVar9) {
              pxVar4 = xmlNewReconciledNs(tree,pxVar10);
              if ((pxVar4 == (xmlNsPtr)0x0) ||
                 ((sizeCache <= (int)uVar9 &&
                  (iVar2 = xmlGrowNsCache(&cache,&sizeCache), pxVar8 = cache, iVar2 < 0)))) {
                local_40 = -1;
              }
              else {
                pxVar8[(int)uVar9].newNs = pxVar4;
                pxVar8[(int)uVar9].oldNs = p_Var1->ns;
                uVar9 = uVar9 + 1;
              }
              p_Var1->ns = pxVar4;
            }
          }
          pp_Var12 = &p_Var1->next;
        }
      }
      if ((p_Var6->children == (_xmlNode *)0x0) ||
         (pxVar11 = p_Var6->children, p_Var6->type == XML_ENTITY_REF_NODE)) {
        if (p_Var6 == tree) break;
        pxVar11 = p_Var6->next;
        if (p_Var6->next == (_xmlNode *)0x0) {
          do {
            if (p_Var6 == tree) goto LAB_0014da72;
            pxVar11 = p_Var6;
            if (p_Var6->parent != (xmlNodePtr)0x0) {
              pxVar11 = p_Var6->parent;
            }
            if ((pxVar11 != tree) && (p_Var6 = pxVar11->next, p_Var6 != (_xmlNode *)0x0))
            goto LAB_0014da72;
            p_Var6 = pxVar11;
          } while (pxVar11->parent != (_xmlNode *)0x0);
          p_Var6 = (_xmlNode *)0x0;
LAB_0014da72:
          pxVar11 = (xmlNodePtr)0x0;
          if (p_Var6 != tree) {
            pxVar11 = p_Var6;
          }
        }
      }
    }
    if (cache != (xmlNsCache *)0x0) {
      (*xmlFree)(cache);
    }
  }
  return local_40;
}

Assistant:

int
xmlReconciliateNs(xmlDocPtr doc, xmlNodePtr tree) {
    xmlNsCache *cache = NULL;
    int sizeCache = 0;
    int nbCache = 0;

    xmlNsPtr n;
    xmlNodePtr node = tree;
    xmlAttrPtr attr;
    int ret = 0, i;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) return(-1);
    if (node->doc != doc) return(-1);
    while (node != NULL) {
        /*
	 * Reconciliate the node namespace
	 */
	if (node->ns != NULL) {
	    for (i = 0; i < nbCache; i++) {
	        if (cache[i].oldNs == node->ns) {
		    node->ns = cache[i].newNs;
		    break;
		}
	    }
	    if (i == nbCache) {
	        /*
		 * OK we need to recreate a new namespace definition
		 */
		n = xmlNewReconciledNs(tree, node->ns);
		if (n == NULL) {
                    ret = -1;
                } else {
		    /*
		     * check if we need to grow the cache buffers.
		     */
		    if ((sizeCache <= nbCache) &&
                        (xmlGrowNsCache(&cache, &sizeCache) < 0)) {
                        ret = -1;
		    } else {
                        cache[nbCache].newNs = n;
                        cache[nbCache++].oldNs = node->ns;
                    }
                }
		node->ns = n;
	    }
	}
	/*
	 * now check for namespace held by attributes on the node.
	 */
	if (node->type == XML_ELEMENT_NODE) {
	    attr = node->properties;
	    while (attr != NULL) {
		if (attr->ns != NULL) {
		    for (i = 0; i < nbCache; i++) {
			if (cache[i].oldNs == attr->ns) {
			    attr->ns = cache[i].newNs;
			    break;
			}
		    }
		    if (i == nbCache) {
			/*
			 * OK we need to recreate a new namespace definition
			 */
			n = xmlNewReconciledNs(tree, attr->ns);
			if (n == NULL) {
                            ret = -1;
                        } else {
			    /*
			     * check if we need to grow the cache buffers.
			     */
                            if ((sizeCache <= nbCache) &&
                                (xmlGrowNsCache(&cache, &sizeCache) < 0)) {
                                ret = -1;
                            } else {
                                cache[nbCache].newNs = n;
                                cache[nbCache++].oldNs = attr->ns;
			    }
			}
			attr->ns = n;
		    }
		}
		attr = attr->next;
	    }
	}

	/*
	 * Browse the full subtree, deep first
	 */
        if ((node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
	    /* deep first */
	    node = node->children;
	} else if ((node != tree) && (node->next != NULL)) {
	    /* then siblings */
	    node = node->next;
	} else if (node != tree) {
	    /* go up to parents->next if needed */
	    while (node != tree) {
	        if (node->parent != NULL)
		    node = node->parent;
		if ((node != tree) && (node->next != NULL)) {
		    node = node->next;
		    break;
		}
		if (node->parent == NULL) {
		    node = NULL;
		    break;
		}
	    }
	    /* exit condition */
	    if (node == tree)
	        node = NULL;
	} else
	    break;
    }
    if (cache != NULL)
	xmlFree(cache);
    return(ret);
}